

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O1

int CoreVfwprintf(CPalThread *pthrCurrent,PAL_FILE *stream,char16_t *format,__va_list_tag *aparg)

{
  short sVar1;
  undefined4 uVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  void *pthrCurrent_00;
  undefined4 Width_00;
  INT Precision_00;
  BOOL BVar6;
  uint uVar7;
  int iVar8;
  INT IVar9;
  errno_t eVar10;
  undefined4 *puVar11;
  LPCSTR pCVar12;
  INT *pIVar13;
  undefined8 *puVar14;
  short *psVar15;
  undefined2 *puVar16;
  ulong uVar17;
  CPalThread *pCVar18;
  size_t sVar19;
  int *piVar20;
  char *pcVar21;
  CPalThread *in_R8;
  LPINT in_R9;
  long lVar22;
  long in_FS_OFFSET;
  ulong uStack_8a8;
  va_list apcopy;
  LPCWSTR Fmt;
  undefined1 local_880 [8];
  WCHAR TempWChar [2];
  INT Flags;
  undefined1 local_86c [8];
  INT Width;
  INT Prefix;
  INT Precision;
  INT Type;
  uint uStack_854;
  va_list ap;
  char local_838 [8];
  char TempSprintfStrBuffer [1024];
  CHAR TempBuff [1024];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  apcopy[0].reg_save_area = format;
  if (!PAL_InitializeChakraCoreCalled) {
LAB_0011dd20:
    abort();
  }
  ap[0].overflow_arg_area = aparg->reg_save_area;
  Type = aparg->gp_offset;
  uStack_854 = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  Precision = 0;
  _TempWChar = (CPalThread *)0x0;
LAB_0011d261:
  if (*apcopy[0].reg_save_area == 0x25) {
    aparg = (__va_list_tag *)(local_880 + 4);
    in_R8 = (CPalThread *)local_86c;
    in_R9 = &Width;
    BVar6 = Internal_ExtractFormatW
                      (pthrCurrent,(LPCWSTR *)&apcopy[0].reg_save_area,TempSprintfStrBuffer + 0x3f8,
                       (LPINT)aparg,(LPINT)in_R8,in_R9,(LPINT)(local_86c + 4),&Prefix);
    IVar9 = Prefix;
    uVar2 = local_86c._4_4_;
    pCVar18 = _TempWChar;
    if (BVar6 == 0) goto LAB_0011d619;
    if ((((local_86c._4_4_ == 4) || (local_86c._4_4_ == 2)) && ((Prefix & 0xfffffffeU) == 2)) ||
       ((Prefix == 3 && ((local_880._4_4_ & 4) != 0)))) {
      if (local_86c._0_4_ == -3) {
        if ((uint)Type < 0x29) {
          _Type = CONCAT44(uStack_854,Type + 8);
        }
        else {
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
      }
      else if (local_86c._0_4_ == -2) {
        uVar17 = _Type & 0xffffffff;
        if (uVar17 < 0x29) {
          _Type = CONCAT44(uStack_854,Type + 8);
          piVar20 = (int *)(uVar17 + (long)ap[0].overflow_arg_area);
        }
        else {
          piVar20 = (int *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        local_86c._0_4_ = *piVar20;
      }
      if (Width == -4) {
        if ((uint)Type < 0x29) {
          _Type = CONCAT44(uStack_854,Type + 8);
        }
        else {
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
      }
      else if (Width == -2) {
        uVar17 = _Type & 0xffffffff;
        if (uVar17 < 0x29) {
          _Type = CONCAT44(uStack_854,Type + 8);
          pIVar13 = (INT *)(uVar17 + (long)ap[0].overflow_arg_area);
        }
        else {
          pIVar13 = (INT *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Width = *pIVar13;
      }
      uVar17 = _Type & 0xffffffff;
      if ((local_86c._4_4_ == 4) || (Prefix == 2)) {
        if ((uint)Type < 0x29) {
          pcVar21 = (char *)(uVar17 + (long)ap[0].overflow_arg_area);
          _Type = CONCAT44(uStack_854,Type + 8);
        }
        else {
          pcVar21 = (char *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        pCVar18 = *(CPalThread **)pcVar21;
        bVar4 = false;
      }
      else {
        if ((uint)Type < 0x29) {
          _Type = CONCAT44(uStack_854,Type + 8);
          puVar14 = (undefined8 *)(uVar17 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar14 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        pCVar12 = (LPCSTR)*puVar14;
        pcVar21 = (char *)0xffffffff;
        in_R8 = (CPalThread *)0x0;
        in_R9 = (LPINT)0x0;
        uVar7 = MultiByteToWideChar(0,0,pCVar12,-1,(LPWSTR)0x0,0);
        if (uVar7 == 0) {
          pcVar21 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
          ;
          in_R8 = (CPalThread *)0x4d8;
          fprintf(_stderr,"] %s %s:%d","CoreVfwprintf");
          fprintf(_stderr,"Unable to convert from multibyte  to wide char.\n");
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
          bVar5 = false;
          bVar4 = false;
        }
        else {
          pCVar18 = (CPalThread *)CorUnix::InternalMalloc((ulong)uVar7 * 2);
          if (pCVar18 == (CPalThread *)0x0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
            bVar5 = false;
            bVar4 = false;
            pCVar18 = (CPalThread *)0x0;
          }
          else {
            pcVar21 = (char *)0xffffffff;
            in_R9 = (LPINT)(ulong)uVar7;
            in_R8 = pCVar18;
            MultiByteToWideChar(0,0,pCVar12,-1,(LPWSTR)pCVar18,uVar7);
            bVar4 = true;
            bVar5 = true;
          }
        }
        if (!bVar5) goto LAB_0011dcef;
      }
      _TempWChar = pCVar18;
      sVar19 = PAL_wcslen((char16_t *)pCVar18);
      lVar22 = (sVar19 << 0x20) + 0x100000000;
      pCVar18 = (CPalThread *)(lVar22 >> 0x1f);
      pthrCurrent = (CPalThread *)CorUnix::InternalMalloc((size_t)pCVar18);
      if (pthrCurrent == (CPalThread *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
        piVar20 = __errno_location();
        *piVar20 = 8;
        if (bVar4) {
          pCVar18 = _TempWChar;
          CorUnix::InternalFree(_TempWChar);
        }
        bVar5 = false;
        aparg = (__va_list_tag *)pcVar21;
        pthrCurrent = pCVar18;
      }
      else {
        if (Width == -3) {
          *(undefined2 *)&pthrCurrent->_vptr_CPalThread = 0;
          iVar8 = 0;
LAB_0011dbf1:
          aparg = (__va_list_tag *)(ulong)(uint)local_880._4_4_;
          IVar9 = Internal_AddPaddingVfwprintf
                            ((CPalThread *)stream,(PAL_FILE *)pthrCurrent,
                             (LPWSTR)(ulong)(uint)(local_86c._0_4_ - iVar8),local_880._4_4_,
                             (INT)in_R8,(BOOL)in_R9);
          if (IVar9 != -1) {
            Precision = Precision + IVar9;
            CorUnix::InternalFree(pthrCurrent);
            bVar5 = true;
            if (bVar4) {
              pthrCurrent = _TempWChar;
              CorUnix::InternalFree(_TempWChar);
            }
            goto LAB_0011dc75;
          }
        }
        else {
          if ((Width < 1) || ((int)sVar19 <= Width)) {
            PAL_wcscpy((char16_t *)pthrCurrent,(char16_t *)_TempWChar);
            iVar8 = (int)sVar19;
            goto LAB_0011dbf1;
          }
          aparg = (__va_list_tag *)(long)(Width + 1);
          eVar10 = wcsncpy_s((char16_t_conflict *)pthrCurrent,lVar22 >> 0x20,
                             (char16_t_conflict *)_TempWChar,(size_t)aparg);
          iVar8 = Width;
          if (eVar10 == 0) goto LAB_0011dbf1;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
        if (bVar4) {
          CorUnix::InternalFree(_TempWChar);
        }
        CorUnix::InternalFree(pthrCurrent);
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
        bVar5 = false;
      }
LAB_0011dc75:
      if (!bVar5) {
LAB_0011dcef:
        Precision = -1;
LAB_0011dcf9:
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
          return Precision;
        }
        __stack_chk_fail();
      }
      goto LAB_0011d261;
    }
    if (Prefix != 1 || local_86c._4_4_ != 2) {
      if (Prefix != 6) {
        if (Prefix == 5 && (local_86c._4_4_ ^ 1) == 0) {
          uVar17 = _Type & 0xffffffff;
          pCVar12 = local_838;
          if (uVar17 < 0x29) {
            _Type = CONCAT44(uStack_854,Type + 8);
            puVar11 = (undefined4 *)(uVar17 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar11 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uVar2 = *puVar11;
          uVar7 = snprintf(pCVar12,0x400,TempSprintfStrBuffer + 0x3f8,(long)(short)uVar2);
          bVar4 = true;
          if (uVar7 < 0x400) {
            pcVar21 = (char *)0x0;
          }
          else {
            pCVar12 = (LPCSTR)CorUnix::InternalMalloc((long)(int)(uVar7 + 1));
            if (pCVar12 == (char *)0x0) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
              piVar20 = __errno_location();
              *piVar20 = 8;
              bVar4 = false;
              pcVar21 = (char *)0x0;
              pCVar12 = local_838;
            }
            else {
              snprintf(pCVar12,(long)(int)(uVar7 + 1),TempSprintfStrBuffer + 0x3f8,
                       (ulong)(uint)(int)(short)uVar2);
              pcVar21 = pCVar12;
            }
          }
        }
        else {
          pCVar12 = local_838;
          if ((local_86c._4_4_ ^ 1) == 0 && Prefix == 4) {
            uVar17 = _Type & 0xffffffff;
            if (uVar17 < 0x29) {
              _Type = CONCAT44(uStack_854,Type + 8);
              psVar15 = (short *)(uVar17 + (long)ap[0].overflow_arg_area);
            }
            else {
              psVar15 = (short *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            sVar1 = *psVar15;
            uVar7 = snprintf(pCVar12,0x400,TempSprintfStrBuffer + 0x3f8,(ulong)(uint)(int)sVar1);
            bVar4 = true;
            if (uVar7 < 0x400) {
              pcVar21 = (char *)0x0;
            }
            else {
              pCVar12 = (LPCSTR)CorUnix::InternalMalloc((long)(int)(uVar7 + 1));
              if (pCVar12 == (char *)0x0) {
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
                piVar20 = __errno_location();
                *piVar20 = 8;
                bVar4 = false;
                pCVar12 = local_838;
                pcVar21 = (char *)0x0;
              }
              else {
                snprintf(pCVar12,(long)(int)(uVar7 + 1),TempSprintfStrBuffer + 0x3f8,
                         (ulong)(uint)(int)sVar1);
                pcVar21 = pCVar12;
              }
            }
          }
          else {
            apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
            uStack_8a8 = _Type;
            apcopy[0].gp_offset = ap[0].gp_offset;
            apcopy[0].fp_offset = ap[0].fp_offset;
            uVar7 = vsnprintf(pCVar12,0x400,TempSprintfStrBuffer + 0x3f8,&uStack_8a8);
            Precision_00 = Width;
            Width_00 = local_86c._0_4_;
            PAL_printf_arg_remover((va_list *)&Type,local_86c._0_4_,Width,IVar9,uVar2);
            bVar4 = true;
            if (uVar7 < 0x400) {
              pCVar12 = local_838;
              pcVar21 = (char *)0x0;
            }
            else {
              pCVar12 = (LPCSTR)CorUnix::InternalMalloc((long)(int)(uVar7 + 1));
              if (pCVar12 == (char *)0x0) {
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
                piVar20 = __errno_location();
                *piVar20 = 8;
                bVar4 = false;
                pCVar12 = local_838;
                pcVar21 = (char *)0x0;
              }
              else {
                apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
                uStack_8a8 = _Type;
                apcopy[0].gp_offset = ap[0].gp_offset;
                apcopy[0].fp_offset = ap[0].fp_offset;
                vsnprintf(pCVar12,(long)(int)(uVar7 + 1),TempSprintfStrBuffer + 0x3f8,&uStack_8a8);
                PAL_printf_arg_remover((va_list *)&Type,Width_00,Precision_00,IVar9,uVar2);
                bVar4 = true;
                pcVar21 = pCVar12;
              }
            }
          }
        }
        if (!bVar4) goto LAB_0011dcef;
        uVar7 = MultiByteToWideChar(0,0,pCVar12,-1,(LPWSTR)0x0,0);
        if (uVar7 == 0) {
          if (PAL_InitializeChakraCoreCalled != false) {
            if (pcVar21 != (char *)0x0) {
              CorUnix::InternalFree(pcVar21);
            }
            goto LAB_0011dca3;
          }
          goto LAB_0011dd20;
        }
        pthrCurrent = (CPalThread *)CorUnix::InternalMalloc((long)(int)uVar7 * 2);
        if (pthrCurrent == (CPalThread *)0x0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
          piVar20 = __errno_location();
          *piVar20 = 8;
        }
        else {
          aparg = (__va_list_tag *)0xffffffff;
          in_R9 = (LPINT)(ulong)uVar7;
          in_R8 = pthrCurrent;
          MultiByteToWideChar(0,0,pCVar12,-1,(LPWSTR)pthrCurrent,uVar7);
          iVar8 = Internal_Convertfwrite
                            (pthrCurrent,(void *)(long)(int)(uVar7 - 1),(size_t)stream->bsdFilePtr,
                             (size_t)aparg,(FILE *)in_R8,(BOOL)in_R9);
          if (iVar8 != -1) {
            if (pcVar21 != (char *)0x0) {
              CorUnix::InternalFree(pcVar21);
            }
            CorUnix::InternalFree(pthrCurrent);
            goto LAB_0011d261;
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
          piVar20 = __errno_location();
          strerror(*piVar20);
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
          CorUnix::InternalFree(pthrCurrent);
        }
        if (pcVar21 != (char *)0x0) {
          CorUnix::InternalFree(pcVar21);
        }
        goto LAB_0011dcef;
      }
      if (local_86c._0_4_ == -2) {
        uVar17 = _Type & 0xffffffff;
        if (uVar17 < 0x29) {
          _Type = CONCAT44(uStack_854,Type + 8);
          piVar20 = (int *)(uVar17 + (long)ap[0].overflow_arg_area);
        }
        else {
          piVar20 = (int *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        local_86c._0_4_ = *piVar20;
      }
      if (Width == -2) {
        uVar17 = _Type & 0xffffffff;
        if (uVar17 < 0x29) {
          _Type = CONCAT44(uStack_854,Type + 8);
          pIVar13 = (INT *)(uVar17 + (long)ap[0].overflow_arg_area);
        }
        else {
          pIVar13 = (INT *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Width = *pIVar13;
      }
      if (local_86c._4_4_ == 1) {
        uVar17 = _Type & 0xffffffff;
        if (uVar17 < 0x29) {
          _Type = CONCAT44(uStack_854,Type + 8);
          puVar14 = (undefined8 *)(uVar17 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar14 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        aparg = (__va_list_tag *)(ulong)(uint)Precision;
        *(short *)*puVar14 = (short)Precision;
      }
      else {
        uVar17 = _Type & 0xffffffff;
        if (uVar17 < 0x29) {
          _Type = CONCAT44(uStack_854,Type + 8);
          puVar14 = (undefined8 *)(uVar17 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar14 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        aparg = (__va_list_tag *)(ulong)(uint)Precision;
        *(INT *)*puVar14 = Precision;
      }
      goto LAB_0011d261;
    }
    if (local_86c._0_4_ + 3 < 2) {
      if ((uint)Type < 0x29) {
        _Type = CONCAT44(uStack_854,Type + 8);
      }
      else {
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
    }
    if ((Width & 0xfffffffdU) == 0xfffffffc) {
      if ((uint)Type < 0x29) {
        _Type = CONCAT44(uStack_854,Type + 8);
      }
      else {
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
    }
    uVar17 = _Type & 0xffffffff;
    if (uVar17 < 0x29) {
      _Type = CONCAT44(uStack_854,Type + 8);
      puVar16 = (undefined2 *)(uVar17 + (long)ap[0].overflow_arg_area);
    }
    else {
      puVar16 = (undefined2 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    local_880._0_2_ = *puVar16;
    local_880._2_2_ = 0;
    aparg = (__va_list_tag *)(ulong)(uint)local_880._4_4_;
    pthrCurrent = (CPalThread *)stream;
    IVar9 = Internal_AddPaddingVfwprintf
                      ((CPalThread *)stream,(PAL_FILE *)local_880,
                       (LPWSTR)(ulong)(local_86c._0_4_ - 1),local_880._4_4_,(INT)in_R8,(BOOL)in_R9);
    if (IVar9 != -1) {
      Precision = Precision + IVar9;
      goto LAB_0011d261;
    }
  }
  else {
    if (*apcopy[0].reg_save_area == 0) {
      if (PAL_InitializeChakraCoreCalled != false) goto LAB_0011dcf9;
      goto LAB_0011dd20;
    }
LAB_0011d619:
    pthrCurrent_00 = apcopy[0].reg_save_area;
    pthrCurrent = (CPalThread *)apcopy[0].reg_save_area;
    apcopy[0].reg_save_area = (void *)((long)apcopy[0].reg_save_area + 2);
    iVar8 = Internal_Convertfwrite
                      ((CPalThread *)pthrCurrent_00,(void *)0x1,(size_t)stream->bsdFilePtr,
                       (size_t)aparg,(FILE *)in_R8,(BOOL)in_R9);
    if (iVar8 != -1) {
      Precision = Precision + 1;
      goto LAB_0011d261;
    }
  }
LAB_0011dca3:
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dd20;
  goto LAB_0011dcef;
}

Assistant:

int CoreVfwprintf(CPalThread *pthrCurrent, PAL_FILE *stream, const char16_t *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCWSTR Fmt = format;
    LPWSTR TempWStr = NULL;
    LPWSTR WorkingWStr = NULL;
    WCHAR TempWChar[2];
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT TempInt;
    BOOL WStrWasMalloced = FALSE;
    int mbtowcResult;
    int written=0;
    int paddingReturnValue;
    int ret;
    va_list ap;

    /* fwprintf for now in the PAL is always used on file opened
       in text mode. In those case the output should be ANSI not Unicode */
    BOOL textMode = TRUE;

    PERF_ENTRY(vfwprintf);
    ENTRY("vfwprintf (stream=%p, format=%p (%S))\n",
          stream, format, format);

    va_copy(ap, aparg);

    while (*Fmt)
    {
        if(*Fmt == '%' &&
                TRUE == Internal_ExtractFormatW(pthrCurrent, &Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (((Prefix == PFF_PREFIX_LONG || Prefix == PFF_PREFIX_LONG_W) &&
                 (Type == PFF_TYPE_STRING || Type == PFF_TYPE_WSTRING)) ||
                 (Type == PFF_TYPE_WSTRING && (Flags & PFF_ZERO) != 0))
            {
                WStrWasMalloced = FALSE;

                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (Type == PFF_TYPE_STRING || Prefix == PFF_PREFIX_LONG_W)
                {
                    TempWStr = va_arg(ap, LPWSTR);
                }
                else
                {
                    /* %lS assumes a LPSTR argument. */
                    LPSTR s = va_arg(ap, LPSTR );
                    UINT Length = 0;
                    Length = MultiByteToWideChar( CP_ACP, 0, s, -1, NULL, 0 );
                    if ( Length != 0 )
                    {
                        TempWStr =
                            (LPWSTR)InternalMalloc( (Length) * sizeof( WCHAR ) );
                        if ( TempWStr )
                        {
                            WStrWasMalloced = TRUE;
                            MultiByteToWideChar( CP_ACP, 0, s, -1,
                                                 TempWStr, Length );
                        }
                        else
                        {
                            ERROR( "InternalMalloc failed.\n" );
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            va_end(ap);
                            return -1;
                        }
                    }
                    else
                    {
                        ASSERT( "Unable to convert from multibyte "
                               " to wide char.\n" );
                        LOGEXIT("vfwprintf returns int -1\n");
                        PERF_EXIT(vfwprintf);
                        va_end(ap);
                        return -1;
                    }
                }

                INT Length = PAL_wcslen(TempWStr);
                WorkingWStr = (LPWSTR) InternalMalloc((sizeof(WCHAR) * (Length + 1)));
                if (!WorkingWStr)
                {
                    ERROR("InternalMalloc failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if (WStrWasMalloced)
                    {
                        InternalFree(TempWStr);
                    }
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *WorkingWStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length)
                {
                    if (wcsncpy_s(WorkingWStr, (Length + 1), TempWStr, Precision+1) != SAFECRT_SUCCESS)
                    {
                        ERROR("Internal_AddPaddingVfwprintf failed\n");
                        if (WStrWasMalloced)
                        {
                            InternalFree(TempWStr);
                        }
                        InternalFree(WorkingWStr);
                        LOGEXIT("wcsncpy_s failed!\n");
                        PERF_EXIT(vfwprintf);
                        va_end(ap);
                        return (-1);
                    }

                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    PAL_wcscpy(WorkingWStr, TempWStr);
                }


                /* do the padding (if needed)*/
                paddingReturnValue =
                    Internal_AddPaddingVfwprintf( pthrCurrent, stream, WorkingWStr,
                                                 Width - Length,
                                                 Flags,textMode);

                if (paddingReturnValue == -1)
                {
                    ERROR("Internal_AddPaddingVfwprintf failed\n");
                    if (WStrWasMalloced)
                    {
                        InternalFree(TempWStr);
                    }
                    InternalFree(WorkingWStr);
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return (-1);
                }
                written += paddingReturnValue;

                InternalFree(WorkingWStr);
                if (WStrWasMalloced)
                {
                    InternalFree(TempWStr);
                }
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar[0] = va_arg(ap, int);
                TempWChar[1] = 0;

               /* do the padding (if needed)*/
                paddingReturnValue =
                    Internal_AddPaddingVfwprintf(pthrCurrent, stream, TempWChar,
                                                 Width - 1,
                                                 Flags,textMode);
                if (paddingReturnValue == -1)
                {
                    ERROR("Internal_AddPaddingVfwprintf failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return(-1);
                }
                written += paddingReturnValue;
            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            else
            {
                // Types that sprintf can handle.

                /* note: I'm using the wide buffer as a (char *) buffer when I
                   pass it to sprintf().  After I get the buffer back I make a
                   backup of the chars copied and then convert them to wide
                   and place them in the buffer (BufferPtr) */

                // This argument will be limited to 1024 characters.
                // It should be enough.
                size_t TEMP_COUNT = 1024;
                char TempSprintfStrBuffer[1024];
                char *TempSprintfStrPtr = NULL;
                char *TempSprintfStr = TempSprintfStrBuffer;
                LPWSTR TempWideBuffer;

                TempInt = 0;
                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = snprintf(TempSprintfStr, TEMP_COUNT, TempBuff, trunc1);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        snprintf(TempSprintfStr, TempInt, TempBuff, trunc2);
                    }
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf(TempSprintfStr, TEMP_COUNT, TempBuff, s);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        snprintf(TempSprintfStr, TempInt, TempBuff, s);
                    }
                }
                else
                {
                    va_list apcopy;

                    va_copy(apcopy, ap);
                    TempInt = vsnprintf(TempSprintfStr, TEMP_COUNT, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        va_copy(apcopy, ap);
                        vsnprintf(TempSprintfStr, TempInt, TempBuff, apcopy);
                        va_end(apcopy);
                        PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                    }
                }

                mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                   TempSprintfStr, -1,
                                                   NULL, 0);

                if (mbtowcResult == 0)
                {
                    ERROR("MultiByteToWideChar failed\n");
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return -1;
                }

                TempWideBuffer = (LPWSTR) InternalMalloc(mbtowcResult*sizeof(WCHAR));
                if (!TempWideBuffer)
                {
                    ERROR("InternalMalloc failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    va_end(ap);
                    return -1;
                }

                MultiByteToWideChar(CP_ACP, 0, TempSprintfStr, -1,
                                    TempWideBuffer, mbtowcResult);

                ret = Internal_Convertfwrite(
                                    pthrCurrent,
                                    TempWideBuffer,
                                    sizeof(char16_t),
                                    mbtowcResult-1,
                                    (FILE*)stream->bsdFilePtr,
                                    textMode);

                if (-1 == ret)
                {
                    ERROR("fwrite() failed with errno == %d (%s)\n", errno, strerror(errno));
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    InternalFree(TempWideBuffer);
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    va_end(ap);
                    return -1;
                }
                if(TempSprintfStrPtr)
                {
                    InternalFree(TempSprintfStrPtr);
                }
                InternalFree(TempWideBuffer);
            }
        }
        else
        {
            ret = Internal_Convertfwrite(
                                    pthrCurrent,
                                    Fmt++,
                                    sizeof(char16_t),
                                    1,
                                    (FILE*)stream->bsdFilePtr,
                                    textMode); /* copy regular chars into buffer */

            if (-1 == ret)
            {
                ERROR("fwrite() failed with errno == %d\n", errno);
                LOGEXIT("vfwprintf returns int -1\n");
                PERF_EXIT(vfwprintf);
                va_end(ap);
                return -1;
            }
            ++written;
       }
    }

    LOGEXIT("vfwprintf returns int %d\n", written);
    PERF_EXIT(vfwprintf);
    va_end(ap);
    return (written);
}